

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageHandler::ParseBullsEyeCovsrcLine
          (cmCTestCoverageHandler *this,string *inputLine,string *sourceFile,int *functionsCalled,
          int *totalFunctions,int *percentFunction,int *branchCovered,int *totalBranches,
          int *percentBranch)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_3a8 [32];
  ostringstream local_388 [8];
  ostringstream cmCTestLog_msg_1;
  string local_210 [32];
  string local_1f0 [48];
  ostringstream local_1c0 [8];
  ostringstream cmCTestLog_msg;
  size_type local_48;
  size_type pos;
  int *percentFunction_local;
  int *totalFunctions_local;
  int *functionsCalled_local;
  string *sourceFile_local;
  string *inputLine_local;
  cmCTestCoverageHandler *this_local;
  
  pos = (size_type)percentFunction;
  percentFunction_local = totalFunctions;
  totalFunctions_local = functionsCalled;
  functionsCalled_local = (int *)sourceFile;
  sourceFile_local = inputLine;
  inputLine_local = (string *)this;
  local_48 = std::__cxx11::string::find((char)inputLine,0x2c);
  if (local_48 == 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar3 = std::operator<<((ostream *)local_1c0,"Error parsing string : ");
    poVar3 = std::operator<<(poVar3,(string *)sourceFile_local);
    std::operator<<(poVar3,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x881,pcVar4,false);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_210,(ulong)sourceFile_local);
    std::__cxx11::string::operator=((string *)functionsCalled_local,local_210);
    std::__cxx11::string::~string(local_210);
    local_48 = local_48 + 1;
    bVar2 = GetNextInt(this,sourceFile_local,&local_48,totalFunctions_local);
    if (bVar2) {
      bVar2 = GetNextInt(this,sourceFile_local,&local_48,percentFunction_local);
      if (bVar2) {
        bVar2 = GetNextInt(this,sourceFile_local,&local_48,(int *)pos);
        if (bVar2) {
          bVar2 = GetNextInt(this,sourceFile_local,&local_48,branchCovered);
          if (bVar2) {
            bVar2 = GetNextInt(this,sourceFile_local,&local_48,totalBranches);
            if (bVar2) {
              bVar2 = GetNextInt(this,sourceFile_local,&local_48,percentBranch);
              if (bVar2) {
                if (local_48 != 0xffffffffffffffff) {
                  std::__cxx11::ostringstream::ostringstream(local_388);
                  poVar3 = std::operator<<((ostream *)local_388,"Error parsing input : ");
                  poVar3 = std::operator<<(poVar3,(string *)sourceFile_local);
                  poVar3 = std::operator<<(poVar3," last pos not npos =  ");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_48);
                  std::operator<<(poVar3,"\n");
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,7,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x89d,pcVar4,false);
                  std::__cxx11::string::~string(local_3a8);
                  std::__cxx11::ostringstream::~ostringstream(local_388);
                }
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCoverageHandler::ParseBullsEyeCovsrcLine(
  std::string const& inputLine, std::string& sourceFile, int& functionsCalled,
  int& totalFunctions, int& percentFunction, int& branchCovered,
  int& totalBranches, int& percentBranch)
{
  // find the first comma
  std::string::size_type pos = inputLine.find(',');
  if (pos == std::string::npos) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing string : " << inputLine << "\n");
    return false;
  }
  // the source file has "" around it so extract out the file name
  sourceFile = inputLine.substr(1, pos - 2);
  pos++;
  if (!this->GetNextInt(inputLine, pos, functionsCalled)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, totalFunctions)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, percentFunction)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, branchCovered)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, totalBranches)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, percentBranch)) {
    return false;
  }
  // should be at the end now
  if (pos != std::string::npos) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing input : "
                 << inputLine << " last pos not npos =  " << pos << "\n");
  }
  return true;
}